

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Sifm::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Sifm *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  pointer ppSVar2;
  MthdSifmSrcSize *pMVar3;
  MthdSifmDvDy *pMVar4;
  MthdClipRect *pMVar5;
  MthdClipXy *pMVar6;
  SingleMthdTest *pSVar7;
  result_type rVar8;
  Test *pTVar9;
  MthdDmaGrobj *this_01;
  MthdCtxPattern *this_02;
  MthdOperation *this_03;
  MthdSifmDuDx *this_04;
  MthdSifmOffset *this_05;
  MthdSifmSrcPos *this_06;
  MthdCtxSurf *pMVar10;
  MthdCtxSurf2D *this_07;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_431;
  undefined1 local_430 [32];
  SingleMthdTest *local_410;
  Test *local_408;
  Test *local_400;
  MthdCtxSurf2D *local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  unsigned_long local_3d8;
  undefined1 local_3d0 [16];
  undefined1 *local_3c0;
  unsigned_long local_3b8;
  undefined1 local_3b0 [16];
  undefined1 *local_3a0;
  unsigned_long local_398;
  undefined1 local_390 [16];
  MthdSifmSrcSize *local_380;
  MthdSifmDvDy *local_378;
  MthdClipRect *local_370;
  MthdClipXy *local_368;
  Test *local_360;
  Test *local_358;
  Test *local_350;
  Test *local_348;
  undefined1 local_340 [32];
  Test *local_320;
  MthdDmaGrobj *local_318;
  MthdCtxPattern *local_310;
  Test *local_308;
  Test *local_300;
  Test *local_2f8;
  Test *local_2f0;
  MthdOperation *local_2e8;
  MthdClipXy *local_2e0;
  MthdClipRect *local_2d8;
  Test *local_2d0;
  Test *local_2c8;
  MthdSifmDuDx *local_2c0;
  MthdSifmDvDy *local_2b8;
  MthdSifmSrcSize *local_2b0;
  Test *local_2a8;
  MthdSifmOffset *local_2a0;
  MthdSifmSrcPos *local_298;
  MthdSifmOffset *local_290;
  MthdSifmDuDx *local_288;
  Test *local_280;
  MthdOperation *local_278;
  Test *local_270;
  MthdCtxPattern *local_268;
  MthdDmaGrobj *local_260;
  SingleMthdTest *local_258;
  undefined1 *local_250;
  unsigned_long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  unsigned_long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  unsigned_long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  unsigned_long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  unsigned_long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  unsigned_long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  unsigned_long local_188;
  undefined1 local_180 [16];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar7 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_258 = pSVar7;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_430._0_8_ = local_430 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)pSVar7,opt,(uint32_t)rVar8);
  (pSVar7->super_MthdTest).trapbit = -1;
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar7->s_cls = uVar1;
  pSVar7->s_mthd = 0x100;
  pSVar7->s_stride = 4;
  pSVar7->s_num = 1;
  pSVar7->s_trapbit = -1;
  (pSVar7->name)._M_dataplus._M_p = (pointer)&(pSVar7->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar7->name,local_430._0_8_,(pointer)(local_430._0_8_ + local_430._8_8_));
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_340._0_8_ = pSVar7;
  local_408 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_400 = (Test *)local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"notify","");
  pTVar9 = local_408;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_408,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_400,
             (long)&(local_3f8->super_SingleMthdTest).super_MthdTest.super_StateTest.
                    super_RepeatTest + (long)&(local_400 + 0x1e)[-0x1e]._vptr_Test);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_340._8_8_ = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"patch","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349758;
  local_340._16_8_ = pTVar9;
  local_410 = (SingleMthdTest *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"pm_trigger","");
  pSVar7 = local_410;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_410,opt,(uint32_t)rVar8);
  (pSVar7->super_MthdTest).trapbit = -1;
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar7->s_cls = uVar1;
  pSVar7->s_mthd = 0x140;
  pSVar7->s_stride = 4;
  pSVar7->s_num = 1;
  pSVar7->s_trapbit = -1;
  (pSVar7->name)._M_dataplus._M_p = (pointer)&(pSVar7->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar7->name,local_3c0,local_3c0 + local_3b8)
  ;
  (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_340._24_8_ = pSVar7;
  local_348 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"dma_notify","");
  pTVar9 = local_348;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_348,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 1;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_3e0,local_3e0 + local_3d8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_320 = pTVar9;
  this_01 = (MthdDmaGrobj *)operator_new(0x25960);
  local_260 = this_01;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dma_src","");
  MthdDmaGrobj::MthdDmaGrobj
            (this_01,opt,(uint32_t)rVar8,&local_70,2,(this->super_Class).cls,0x184,0,0);
  local_318 = this_01;
  this_02 = (MthdCtxPattern *)operator_new(0x25958);
  local_268 = this_02;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ctx_pattern","");
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_02,opt,(uint32_t)rVar8,&local_90,3,uVar1,0x188,uVar1 != 0x37);
  local_310 = this_02;
  local_350 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"ctx_rop","");
  pTVar9 = local_350;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_350,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 4;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_190,local_190 + local_188);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349a40;
  local_308 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  local_270 = pTVar9;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"ctx_beta","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 5;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_1b0,local_1b0 + local_1a8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349b38;
  local_300 = pTVar9;
  local_358 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"missing","");
  pTVar9 = local_358;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_358,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_1d0,local_1d0 + local_1c8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_2f8 = pTVar9;
  local_360 = (Test *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"format","");
  pTVar9 = local_360;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_360,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 8;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_1f0,local_1f0 + local_1e8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f400;
  *(bool *)(pTVar9[0x1e].rnd._M_x + 0x119) = uVar1 != 0x37;
  local_2f0 = pTVar9;
  this_03 = (MthdOperation *)operator_new(0x25958);
  local_278 = this_03;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"operation","");
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation(this_03,opt,(uint32_t)rVar8,&local_b0,9,uVar1,0x304,uVar1 != 0x37);
  local_2e8 = this_03;
  local_368 = (MthdClipXy *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"clip_xy","");
  pMVar6 = local_368;
  MthdClipXy::MthdClipXy
            (local_368,opt,(uint32_t)rVar8,&local_d0,10,(this->super_Class).cls,0x308,1,false);
  local_2e0 = pMVar6;
  local_370 = (MthdClipRect *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"clip_rect","");
  pMVar5 = local_370;
  MthdClipRect::MthdClipRect
            (local_370,opt,(uint32_t)rVar8,&local_f0,0xb,(this->super_Class).cls,0x30c,1);
  local_2d8 = pMVar5;
  pTVar9 = (Test *)operator_new(0x25950);
  local_280 = pTVar9;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"xy","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_210,local_210 + local_208);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f4f8;
  local_2d0 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"rect","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined8 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x400000314;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(uint *)(pTVar9[0x1e].rnd._M_x + 0x114) = (uint)(uVar1 != 0x37) * 2 + 0xb;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_230,local_230 + local_228);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f5f0;
  local_2c8 = pTVar9;
  this_04 = (MthdSifmDuDx *)operator_new(0x25958);
  local_288 = this_04;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"dudx","");
  anon_unknown_14::MthdSifmDuDx::MthdSifmDuDx
            (this_04,opt,(uint32_t)rVar8,&local_110,0xe,(this->super_Class).cls,0x318,0);
  local_2c0 = this_04;
  local_378 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"dvdy","");
  pMVar4 = local_378;
  anon_unknown_14::MthdSifmDvDy::MthdSifmDvDy
            (local_378,opt,(uint32_t)rVar8,&local_130,0xf,(this->super_Class).cls,0x31c,0);
  local_2b8 = pMVar4;
  local_380 = (MthdSifmSrcSize *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"src_size","");
  pMVar3 = local_380;
  anon_unknown_14::MthdSifmSrcSize::MthdSifmSrcSize
            (local_380,opt,(uint32_t)rVar8,&local_150,0x10,(this->super_Class).cls,0x400,0);
  local_2b0 = pMVar3;
  pTVar9 = (Test *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"pitch","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar8);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_250,local_250 + local_248);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f9d0;
  local_2a8 = pTVar9;
  this_05 = (MthdSifmOffset *)operator_new(0x25958);
  local_290 = this_05;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"offset","");
  anon_unknown_14::MthdSifmOffset::MthdSifmOffset
            (this_05,opt,(uint32_t)rVar8,&local_170,0x12,(this->super_Class).cls,0x408,0);
  local_2a0 = this_05;
  this_06 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"src_pos","");
  anon_unknown_14::MthdSifmSrcPos::MthdSifmSrcPos
            (this_06,opt,(uint32_t)rVar8,&local_50,0x13,(this->super_Class).cls,0x40c,0,true);
  __l._M_len = 0x16;
  __l._M_array = (iterator)local_340;
  local_298 = this_06;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_431);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_400 != (Test *)local_3f0) {
    operator_delete(local_400);
  }
  if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
    operator_delete((void *)local_430._0_8_);
  }
  if ((this->super_Class).cls == 0xe) {
    pTVar9 = (Test *)(__return_storage_ptr__->
                     super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
    pSVar7 = (SingleMthdTest *)operator_new(0x25950);
    local_410 = pSVar7;
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_430._0_8_ = local_430 + 0x10;
    local_408 = pTVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"src_size_yuv420","");
    uVar1 = (this->super_Class).cls;
    Test::Test((Test *)pSVar7,opt,(uint32_t)rVar8);
    (pSVar7->super_MthdTest).trapbit = -1;
    (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00348698;
    pSVar7->s_cls = uVar1;
    pSVar7->s_mthd = 0x400;
    pSVar7->s_stride = 4;
    pSVar7->s_num = 1;
    pSVar7->s_trapbit = -1;
    (pSVar7->name)._M_dataplus._M_p = (pointer)&(pSVar7->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar7->name,local_430._0_8_,(pointer)(local_430._0_8_ + local_430._8_8_))
    ;
    (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_0034fcb8;
    local_340._0_8_ = pSVar7;
    pTVar9 = (Test *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_400 = (Test *)local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"pitch_yuv420","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar9,opt,(uint32_t)rVar8);
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x404;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_400,
               (long)&(local_3f8->super_SingleMthdTest).super_MthdTest.super_StateTest.
                      super_RepeatTest + (long)&(local_400 + 0x1e)[-0x1e]._vptr_Test);
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034fdb0;
    local_340._8_8_ = pTVar9;
    pTVar9 = (Test *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3a0 = local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"offset_yuv420","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar9,opt,(uint32_t)rVar8);
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x408;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 3;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034fea8;
    local_340._16_8_ = pTVar9;
    pSVar7 = (SingleMthdTest *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3c0 = local_3b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"src_pos_yuv420","");
    uVar1 = (this->super_Class).cls;
    Test::Test((Test *)pSVar7,opt,(uint32_t)rVar8);
    (pSVar7->super_MthdTest).trapbit = -1;
    (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00348698;
    pSVar7->s_cls = uVar1;
    pSVar7->s_mthd = 0x414;
    pSVar7->s_stride = 4;
    pSVar7->s_num = 1;
    pSVar7->s_trapbit = -1;
    (pSVar7->name)._M_dataplus._M_p = (pointer)&(pSVar7->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar7->name,local_3c0,local_3c0 + local_3b8);
    (pSVar7->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_0034ffa0;
    local_340._24_8_ = pSVar7;
    pTVar9 = (Test *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_3e0 = local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"invalid_yuv420","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar9,opt,(uint32_t)rVar8);
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x410;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 2;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_3e0,local_3e0 + local_3d8);
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350098;
    local_320 = pTVar9;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,local_408,local_340);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
    if (local_3c0 != local_3b0) {
      operator_delete(local_3c0);
    }
    if (local_3a0 != local_390) {
      operator_delete(local_3a0);
    }
    if (local_400 != (Test *)local_3f0) {
      operator_delete(local_400);
    }
    if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
      operator_delete((void *)local_430._0_8_);
    }
  }
  ppSVar2 = (__return_storage_ptr__->
            super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_Class).cls == 0x37) {
    pMVar10 = (MthdCtxSurf *)operator_new(0x25958);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_340._0_8_ = (SingleMthdTest *)(local_340 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"ctx_dst","");
    MthdCtxSurf::MthdCtxSurf
              (pMVar10,opt,(uint32_t)rVar8,(string *)local_340,7,(this->super_Class).cls,0x194,0);
    local_430._0_8_ = pMVar10;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar2,local_430);
    if ((SingleMthdTest *)local_340._0_8_ != (SingleMthdTest *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  else {
    pTVar9 = (Test *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_340._0_8_ = (SingleMthdTest *)(local_340 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"ctx_beta4","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar9,opt,(uint32_t)rVar8);
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 6;
    pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_340._0_8_,
               (pointer)(local_340._0_8_ + (long)((mt19937 *)(local_340._8_8_ + 8) + -1) + 0x1380));
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349c30;
    local_400 = pTVar9;
    this_07 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_430._0_8_ = local_430 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"ctx_surf2d","");
    uVar1 = (this->super_Class).cls;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_07,opt,(uint32_t)rVar8,(string *)local_430,7,uVar1,0x198,uVar1 != 0x77 | 2);
    local_3f8 = this_07;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar2,&local_400);
    if ((MthdCtxSurf *)local_430._0_8_ != (MthdCtxSurf *)(local_430 + 0x10)) {
      operator_delete((void *)local_430._0_8_);
    }
    if ((SingleMthdTest *)local_340._0_8_ != (SingleMthdTest *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  uVar1 = (this->super_Class).cls;
  if (uVar1 == 99 || (char)uVar1 == -0x77) {
    ppSVar2 = (__return_storage_ptr__->
              super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pMVar10 = (MthdCtxSurf *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_340._0_8_ = (SingleMthdTest *)(local_340 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"dither","");
    uVar1 = (this->super_Class).cls;
    Test::Test((Test *)pMVar10,opt,(uint32_t)rVar8);
    (pMVar10->super_SingleMthdTest).super_MthdTest.trapbit = -1;
    (pMVar10->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
    _vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    (pMVar10->super_SingleMthdTest).s_cls = uVar1;
    (pMVar10->super_SingleMthdTest).s_mthd = 0x2fc;
    (pMVar10->super_SingleMthdTest).s_stride = 4;
    (pMVar10->super_SingleMthdTest).s_num = 1;
    (pMVar10->super_SingleMthdTest).s_trapbit = 0x14;
    (pMVar10->super_SingleMthdTest).name._M_dataplus._M_p =
         (pointer)&(pMVar10->super_SingleMthdTest).name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar10->super_SingleMthdTest).name,local_340._0_8_,
               (pointer)(local_340._0_8_ + (long)((mt19937 *)(local_340._8_8_ + 8) + -1) + 0x1380));
    (pMVar10->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
    _vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349660;
    local_430._0_8_ = pMVar10;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar2,local_430);
    if ((SingleMthdTest *)local_340._0_8_ != (SingleMthdTest *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  if ((char)(this->super_Class).cls == -0x77) {
    ppSVar2 = (__return_storage_ptr__->
              super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar9 = (Test *)operator_new(0x25950);
    rVar8 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_340._0_8_ = (SingleMthdTest *)(local_340 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"sync","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar9,opt,(uint32_t)rVar8);
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x108;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_340._0_8_,
               (pointer)(local_340._0_8_ + (long)((mt19937 *)(local_340._8_8_ + 8) + -1) + 0x1380));
    pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348ac0;
    local_430._0_8_ = pTVar9;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>
              ((vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
                *)__return_storage_ptr__,ppSVar2,local_430);
    if ((SingleMthdTest *)local_340._0_8_ != (SingleMthdTest *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Sifm::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x37),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdSifmFormat(opt, rnd(), "format", 8, cls, 0x300, cls != 0x37),
		new MthdOperation(opt, rnd(), "operation", 9, cls, 0x304, cls != 0x37),
		new MthdClipXy(opt, rnd(), "clip_xy", 10, cls, 0x308, 1, 0),
		new MthdClipRect(opt, rnd(), "clip_rect", 11, cls, 0x30c, 1),
		new MthdSifmXy(opt, rnd(), "xy", 12, cls, 0x310),
		new MthdSifmRect(opt, rnd(), "rect", cls == 0x37 ? 11 : 13, cls, 0x314),
		new MthdSifmDuDx(opt, rnd(), "dudx", 14, cls, 0x318, 0),
		new MthdSifmDvDy(opt, rnd(), "dvdy", 15, cls, 0x31c, 0),
		new MthdSifmSrcSize(opt, rnd(), "src_size", 16, cls, 0x400, 0),
		new MthdSifmPitch(opt, rnd(), "pitch", 17, cls, 0x404),
		new MthdSifmOffset(opt, rnd(), "offset", 18, cls, 0x408, 0),
		new MthdSifmSrcPos(opt, rnd(), "src_pos", 19, cls, 0x40c, 0, true),
	};
	if (cls == 0xe) {
		res.insert(res.end(), {
			new MthdSyfmSrcSize(opt, rnd(), "src_size_yuv420", -1, cls, 0x400),
			new MthdSyfmPitch(opt, rnd(), "pitch_yuv420", -1, cls, 0x404),
			new MthdSyfmOffset(opt, rnd(), "offset_yuv420", -1, cls, 0x408, 3),
			new MthdSyfmSrcPos(opt, rnd(), "src_pos_yuv420", -1, cls, 0x414),
			new MthdSifmInvalid(opt, rnd(), "invalid_yuv420", -1, cls, 0x410, 2),
		});
	}
	if (cls == 0x37) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, (cls == 0x77 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		});
	}
	if (cls == 0x63 || (cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdDither(opt, rnd(), "dither", 20, cls, 0x2fc),
		});
	}
	if ((cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}